

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageCommand.cxx
# Opt level: O2

bool __thiscall cmCTestCoverageCommand::CheckArgumentValue(cmCTestCoverageCommand *this,string *arg)

{
  int iVar1;
  uint uVar2;
  pointer ppcVar3;
  cmMakefile *this_00;
  cmCTest *this_01;
  ostream *poVar4;
  string sStack_1c0;
  ostringstream aoStack_1a0 [376];
  
  if ((this->super_cmCTestHandlerCommand).ArgumentDoing == 3) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->Labels,arg);
    return true;
  }
  iVar1 = (this->super_cmCTestHandlerCommand).ArgumentDoing;
  if (iVar1 == 2) {
    (this->super_cmCTestHandlerCommand).ArgumentDoing = 0;
    uVar2 = (this->super_cmCTestHandlerCommand).ArgumentIndex;
    ppcVar3 = (this->super_cmCTestHandlerCommand).Values.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppcVar3[uVar2] == (char *)0x0) {
      ppcVar3[uVar2] = (arg->_M_dataplus)._M_p;
      std::__cxx11::ostringstream::ostringstream(aoStack_1a0);
      poVar4 = std::operator<<((ostream *)aoStack_1a0,"Set ");
      poVar4 = std::operator<<(poVar4,(this->super_cmCTestHandlerCommand).Arguments.
                                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar2]);
      poVar4 = std::operator<<(poVar4," to ");
      poVar4 = std::operator<<(poVar4,(string *)arg);
      std::operator<<(poVar4,"\n");
      this_01 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(this_01,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                   ,0xd0,sStack_1c0._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&sStack_1c0);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(aoStack_1a0);
      poVar4 = std::operator<<((ostream *)aoStack_1a0,"Called with more than one value for ");
      std::operator<<(poVar4,(this->super_cmCTestHandlerCommand).Arguments.
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar2]);
      this_00 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&sStack_1c0,false);
      std::__cxx11::string::~string((string *)&sStack_1c0);
      (this->super_cmCTestHandlerCommand).ArgumentDoing = 1;
    }
    std::__cxx11::ostringstream::~ostringstream(aoStack_1a0);
  }
  return iVar1 == 2;
}

Assistant:

bool cmCTestCoverageCommand::CheckArgumentValue(std::string const& arg)
{
  // Handle states specific to this command.
  if(this->ArgumentDoing == ArgumentDoingLabels)
    {
    this->Labels.insert(arg);
    return true;
    }

  // Look for other arguments.
  return this->Superclass::CheckArgumentValue(arg);
}